

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

reference __thiscall
absl::
InlinedVector<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
::back(InlinedVector<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
       *this)

{
  reference ppCVar1;
  CordRep **ppCVar2;
  ulong uVar3;
  Data *pDVar4;
  undefined8 *in_RSI;
  ulong uVar5;
  size_type __n;
  CordRep **ppCStack_40;
  SizeType<std::allocator<absl::cord_internal::CordRep_*>_> SStack_38;
  
  uVar5 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if (1 < uVar5) {
    if ((uVar5 & 1) == 0) {
      pDVar4 = &(this->storage_).data_;
    }
    else {
      pDVar4 = (Data *)(this->storage_).data_.allocated.allocated_data;
    }
    return (reference)((long)pDVar4 + (uVar5 & 0xfffffffffffffffe) * 4 + -8);
  }
  InlinedVector<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>::
  back();
  uVar5 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  uVar3 = 2;
  if ((uVar5 & 1) != 0) {
    uVar3 = (this->storage_).data_.allocated.allocated_capacity;
  }
  if (uVar5 >> 1 != uVar3) {
    if ((uVar5 & 1) == 0) {
      pDVar4 = &(this->storage_).data_;
    }
    else {
      pDVar4 = (Data *)(this->storage_).data_.allocated.allocated_data;
    }
    ppCVar1 = (reference)((long)pDVar4 + (uVar5 >> 1) * 8);
    *ppCVar1 = (ValueType<std::allocator<absl::cord_internal::CordRep_*>_>)*in_RSI;
    (this->storage_).metadata_.
    super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value = uVar5 + 2;
    return ppCVar1;
  }
  uVar5 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  pDVar4 = (Data *)(this->storage_).data_.allocated.allocated_data;
  ppCStack_40 = (CordRep **)0x0;
  SStack_38 = 0;
  __n = 4;
  if ((uVar5 & 1) != 0) {
    __n = (this->storage_).data_.allocated.allocated_capacity * 2;
  }
  ppCStack_40 = __gnu_cxx::new_allocator<absl::cord_internal::CordRep_*>::allocate
                          ((new_allocator<absl::cord_internal::CordRep_*> *)&ppCStack_40,__n,
                           (void *)0x0);
  uVar3 = uVar5 >> 1;
  ppCStack_40[uVar3] = (CordRep *)*in_RSI;
  if (1 < uVar5) {
    if ((uVar5 & 1) == 0) {
      pDVar4 = &(this->storage_).data_;
    }
    uVar5 = 0;
    do {
      ppCStack_40[uVar5] =
           *(Pointer<std::allocator<absl::cord_internal::CordRep_*>_>)((long)pDVar4 + uVar5 * 8);
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  ppCVar2 = ppCStack_40 + uVar3;
  uVar5 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  SStack_38 = __n;
  if ((uVar5 & 1) != 0) {
    operator_delete((this->storage_).data_.allocated.allocated_data,
                    (this->storage_).data_.allocated.allocated_capacity << 3);
    uVar5 = (this->storage_).metadata_.
            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
  }
  (this->storage_).data_.allocated.allocated_data = ppCStack_40;
  (this->storage_).data_.allocated.allocated_capacity = SStack_38;
  (this->storage_).metadata_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value = (uVar5 | 1) + 2;
  return ppCVar2;
}

Assistant:

SizeType<A> GetSize() const { return GetSizeAndIsAllocated() >> 1; }